

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

void hmac_key(ssh2_mac *mac,ptrlen key)

{
  ssh2_mac *psVar1;
  strbuf *local_60;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  strbuf *sb;
  size_t klen;
  uint8_t *kp;
  hmac *ctx;
  ssh2_mac *mac_local;
  ptrlen key_local;
  
  sb = (strbuf *)key.len;
  klen = (size_t)key.ptr;
  psVar1 = mac + -3;
  i = 0;
  if ((strbuf *)psVar1->vt->name < sb) {
    i = (size_t)strbuf_new_nm();
    strbuf_append((strbuf *)i,(size_t)psVar1->vt->text_name);
    hash_simple((ssh_hashalg *)psVar1->vt,key,((strbuf *)i)->u);
    klen = (size_t)((strbuf *)i)->u;
    sb = (strbuf *)((strbuf *)i)->len;
  }
  ssh_hash_reset((ssh_hash *)mac[-3].binarysink_);
  for (i_1 = 0; i_1 < sb; i_1 = i_1 + 1) {
    BinarySink_put_byte((BinarySink *)(mac[-3].binarysink_)->writefmtv,*(byte *)(klen + i_1) ^ 0x5c)
    ;
  }
  for (i_2 = (size_t)sb; i_2 < psVar1->vt->name; i_2 = i_2 + 1) {
    BinarySink_put_byte((BinarySink *)(mac[-3].binarysink_)->writefmtv,'\\');
  }
  ssh_hash_reset((ssh_hash *)mac[-2].vt);
  for (i_3 = 0; i_3 < sb; i_3 = i_3 + 1) {
    BinarySink_put_byte((BinarySink *)(mac[-2].vt)->free,*(byte *)(klen + i_3) ^ 0x36);
  }
  for (local_60 = sb; local_60 < (strbuf *)psVar1->vt->name;
      local_60 = (strbuf *)((long)&local_60->s + 1)) {
    BinarySink_put_byte((BinarySink *)(mac[-2].vt)->free,'6');
  }
  if (i != 0) {
    strbuf_free((strbuf *)i);
  }
  return;
}

Assistant:

static void hmac_key(ssh2_mac *mac, ptrlen key)
{
    struct hmac *ctx = container_of(mac, struct hmac, mac);

    const uint8_t *kp;
    size_t klen;
    strbuf *sb = NULL;

    if (key.len > ctx->hashalg->blocklen) {
        /*
         * RFC 2104 section 2: if the key exceeds the block length of
         * the underlying hash, then we start by hashing the key, and
         * use that hash as the 'true' key for the HMAC construction.
         */
        sb = strbuf_new_nm();
        strbuf_append(sb, ctx->hashalg->hlen);
        hash_simple(ctx->hashalg, key, sb->u);
        kp = sb->u;
        klen = sb->len;
    } else {
        /*
         * A short enough key is used as is.
         */
        kp = (const uint8_t *)key.ptr;
        klen = key.len;
    }

    ssh_hash_reset(ctx->h_outer);
    for (size_t i = 0; i < klen; i++)
        put_byte(ctx->h_outer, PAD_OUTER ^ kp[i]);
    for (size_t i = klen; i < ctx->hashalg->blocklen; i++)
        put_byte(ctx->h_outer, PAD_OUTER);

    ssh_hash_reset(ctx->h_inner);
    for (size_t i = 0; i < klen; i++)
        put_byte(ctx->h_inner, PAD_INNER ^ kp[i]);
    for (size_t i = klen; i < ctx->hashalg->blocklen; i++)
        put_byte(ctx->h_inner, PAD_INNER);

    if (sb)
        strbuf_free(sb);
}